

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const(&)[58],kj::StringPtr,char_const(&)[39],kj::StringPtr,char_const(&)[36],kj::StringPtr,char_const(&)[57],kj::StringPtr,char_const(&)[70]>
          (String *__return_storage_ptr__,kj *this,char (*params) [58],StringPtr *params_1,
          char (*params_2) [39],StringPtr *params_3,char (*params_4) [36],StringPtr *params_5,
          char (*params_6) [57],StringPtr *params_7,char (*params_8) [70])

{
  char (*value) [58];
  StringPtr *pSVar1;
  char (*value_00) [39];
  char (*value_01) [36];
  char (*value_02) [57];
  char (*value_03) [70];
  ArrayPtr<const_char> *in_stack_ffffffffffffff18;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  StringPtr *local_40;
  char (*params_local_4) [36];
  StringPtr *params_local_3;
  char (*params_local_2) [39];
  StringPtr *params_local_1;
  char (*params_local) [58];
  
  local_40 = params_3;
  params_local_4 = (char (*) [36])params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [39])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [58])__return_storage_ptr__;
  value = ::const((char (*) [58])this);
  local_50 = toCharSequence<char_const(&)[58]>(value);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_2);
  local_60 = toCharSequence<kj::StringPtr>(pSVar1);
  value_00 = ::const((char (*) [39])params_local_3);
  local_70 = toCharSequence<char_const(&)[39]>(value_00);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_4);
  local_80 = toCharSequence<kj::StringPtr>(pSVar1);
  value_01 = ::const((char (*) [36])local_40);
  local_90 = toCharSequence<char_const(&)[36]>(value_01);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_4);
  local_a0 = toCharSequence<kj::StringPtr>(pSVar1);
  value_02 = ::const((char (*) [57])params_5);
  local_b0 = toCharSequence<char_const(&)[57]>(value_02);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_6);
  local_c0 = toCharSequence<kj::StringPtr>(pSVar1);
  value_03 = ::const((char (*) [70])params_7);
  local_d0 = toCharSequence<char_const(&)[70]>(value_03);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,&local_60,&local_70,&local_80,&local_90,&local_a0
             ,&local_b0,&local_c0,&local_d0,in_stack_ffffffffffffff18);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}